

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::date_time::date_time(date_time *this,date_time_period_set *s)

{
  period_mark pVar1;
  date_time_period_set *this_00;
  abstract_calendar *paVar2;
  date_time_period *pdVar3;
  hold_ptr<booster::locale::abstract_calendar> *in_RDI;
  uint i;
  locale *in_stack_ffffffffffffff60;
  date_time_period_set *in_stack_ffffffffffffff78;
  locale *this_01;
  uint local_4c;
  string local_48 [48];
  locale local_18 [3];
  
  this_01 = local_18;
  std::locale::locale(this_01);
  this_00 = (date_time_period_set *)
            std::use_facet<booster::locale::calendar_facet>(in_stack_ffffffffffffff60);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)this_00 + 0x10))();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr(in_RDI,paVar2);
  std::locale::~locale(local_18);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
  time_zone::global_abi_cxx11_();
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,local_48);
  std::__cxx11::string::~string(local_48);
  local_4c = 0;
  while( true ) {
    in_stack_ffffffffffffff78 =
         (date_time_period_set *)date_time_period_set::size(in_stack_ffffffffffffff78);
    if (in_stack_ffffffffffffff78 <= (date_time_period_set *)(ulong)local_4c) break;
    paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
    pdVar3 = date_time_period_set::operator[](this_00,(size_t)this_01);
    pVar1 = period::period_type::mark((period_type *)pdVar3);
    pdVar3 = date_time_period_set::operator[](this_00,(size_t)this_01);
    (*paVar2->_vptr_abstract_calendar[1])(paVar2,(ulong)pVar1,(ulong)*(uint *)(pdVar3 + 4));
    local_4c = local_4c + 1;
  }
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RDI);
  (*paVar2->_vptr_abstract_calendar[2])();
  return;
}

Assistant:

date_time::date_time(date_time_period_set const &s) :
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(time_zone::global());
    for(unsigned i=0;i<s.size();i++) {
        impl_->set_value(s[i].type.mark(),s[i].value);
    }
    impl_->normalize();
}